

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFilesForXcode
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  pointer ppcVar1;
  cmSourceFile *pcVar2;
  cmLocalGenerator *this_00;
  pointer ppcVar3;
  int iVar4;
  string *psVar5;
  ostream *poVar6;
  iterator __begin3;
  pointer ppcVar7;
  undefined4 uVar8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files_00;
  pointer ppcVar9;
  iterator __end3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string thisConfigFiles;
  string firstConfigFiles;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range3;
  ostringstream e;
  bool local_269;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_268;
  string *local_248;
  string local_240;
  undefined4 local_21c;
  char *local_218;
  long local_210;
  char local_208;
  undefined7 uStack_207;
  char *local_1f8;
  long local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  cmGeneratorTarget *local_1d8;
  string *local_1d0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_1c0,this->Makefile,IncludeEmptyConfig);
  local_1c8 = files;
  GetSourceFilesWithoutObjectLibraries
            (this,files,
             local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_269 = local_1c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_1c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (!local_269) {
    local_1d0 = local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_1d8 = this;
    do {
      local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      files_00 = &local_268;
      local_248 = local_1c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      GetSourceFilesWithoutObjectLibraries
                (this,files_00,
                 local_1c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      ppcVar3 = local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppcVar7 = (local_1c8->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppcVar1 = (local_1c8->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      uVar8 = (undefined4)CONCAT71((int7)((ulong)files_00 >> 8),1);
      if ((long)local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start == (long)ppcVar1 - (long)ppcVar7) {
        if (local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar8 = 0;
        }
        else {
          ppcVar9 = ppcVar7;
          iVar4 = bcmp(local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,ppcVar7,
                       (long)local_268.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_268.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          uVar8 = (undefined4)CONCAT71((int7)((ulong)ppcVar9 >> 8),iVar4 != 0);
        }
      }
      if ((char)uVar8 == '\0') {
        this = local_1d8;
        if (ppcVar3 != (pointer)0x0) {
          operator_delete(ppcVar3,(long)local_268.
                                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)ppcVar3);
          this = local_1d8;
        }
      }
      else {
        local_1f8 = &local_1e8;
        local_1f0 = 0;
        local_1e8 = '\0';
        local_21c = uVar8;
        ppcVar3 = local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (; local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_finish = ppcVar3, ppcVar7 != ppcVar1;
            ppcVar7 = ppcVar7 + 1) {
          pcVar2 = *ppcVar7;
          std::__cxx11::string::append((char *)&local_1f8);
          psVar5 = cmSourceFile::ResolveFullPath(pcVar2,(string *)0x0,(string *)0x0);
          std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)(psVar5->_M_dataplus)._M_p);
          ppcVar3 = local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        local_218 = &local_208;
        local_210 = 0;
        local_208 = '\0';
        for (ppcVar7 = local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar3;
            ppcVar7 = ppcVar7 + 1) {
          pcVar2 = *ppcVar7;
          std::__cxx11::string::append((char *)&local_218);
          psVar5 = cmSourceFile::ResolveFullPath(pcVar2,(string *)0x0,(string *)0x0);
          std::__cxx11::string::_M_append((char *)&local_218,(ulong)(psVar5->_M_dataplus)._M_p);
        }
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        this = local_1d8;
        psVar5 = cmTarget::GetName_abi_cxx11_(local_1d8->Target);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "\" has source files which vary by configuration. This is not supported by the \""
                   ,0x4e);
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_240);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_240._M_dataplus._M_p,local_240._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" generator.\nConfig \"",0x15);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(local_1d0->_M_dataplus)._M_p,local_1d0->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\":\n  ",5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1f8,local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConfig \"",9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(local_248->_M_dataplus)._M_p,local_248->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\":\n  ",5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_218,local_210);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        this_00 = this->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        if (local_218 != &local_208) {
          operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
        }
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
        }
        if (local_268.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_268.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_268.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_268.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((char)local_21c != '\0') break;
      }
      local_1c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_248 + 1;
      local_269 = local_1c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_1c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    } while (!local_269);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  return local_269;
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFilesForXcode(
  std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> const& configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFilesWithoutObjectLibraries(files, firstConfig);

  for (; it != configs.end(); ++it) {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFilesWithoutObjectLibraries(configFiles, *it);
    if (configFiles != files) {
      std::string firstConfigFiles;
      const char* sep = "";
      for (cmSourceFile* f : files) {
        firstConfigFiles += sep;
        firstConfigFiles += f->ResolveFullPath();
        sep = "\n  ";
      }

      std::string thisConfigFiles;
      sep = "";
      for (cmSourceFile* f : configFiles) {
        thisConfigFiles += sep;
        thisConfigFiles += f->ResolveFullPath();
        sep = "\n  ";
      }
      std::ostringstream e;
      /* clang-format off */
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      /* clang-format on */
      this->LocalGenerator->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }
  return true;
}